

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall GEO::geofile::simplify_plane_surfaces(geofile *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 this_00;
  geofile *pgVar2;
  _Rb_tree_header *p_Var3;
  geofile *pgVar4;
  geofile *this_01;
  _Self __tmp;
  ulong uVar5;
  _Self __tmp_1;
  long lVar6;
  ulong uVar7;
  set<int,_std::less<int>,_std::allocator<int>_> gaps;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  undefined1 local_fc [12];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = (long)(int)(this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     [1]._M_color;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((1 < lVar6) && (uVar7 = lVar6 - 1, (int)uVar7 != 0)) {
    uVar5 = 1;
    do {
      local_fc._0_4_ = (undefined4)uVar5;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_f0,(int *)local_fc);
      uVar5 = uVar5 + 1;
    } while (uVar5 <= uVar7);
  }
  p_Var1 = &(this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
  this_01 = (geofile *)p_Var1;
  pgVar2 = (geofile *)std::_Rb_tree_decrement(&p_Var1->_M_header);
  pgVar4 = (geofile *)
           (this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_fc._4_8_ = this;
  if (pgVar4 != pgVar2) {
    do {
      this_01 = pgVar4;
      lVar6 = std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
      p_Var3 = &(this_01->points_map)._M_t._M_impl.super__Rb_tree_header;
      while (local_fc._0_4_ = (p_Var3->_M_header)._M_color + _S_black,
            (int)local_fc._0_4_ < *(int *)(lVar6 + 0x20)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_f0,(int *)local_fc);
        p_Var3 = (_Rb_tree_header *)local_fc;
      }
      pgVar4 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
    } while (pgVar4 != pgVar2);
  }
  this_00 = local_fc._4_8_;
  if (local_f0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pgVar4 = (geofile *)
             (((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              (local_fc._4_8_ + 0xa8))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pgVar4 != (geofile *)p_Var1) {
      do {
        this_01 = pgVar4;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_90,(int *)&(this_01->points_map)._M_t._M_impl.super__Rb_tree_header);
        pgVar4 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
      } while (pgVar4 != (geofile *)p_Var1);
    }
    perform_shift(this_01,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_f0,
                  (set<int,_std::less<int>,_std::allocator<int>_> *)&local_90,
                  (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  &local_c0);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&local_60,&local_c0);
    adjust_plane_surfaces
              ((geofile *)this_00,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_f0);
  return 0;
}

Assistant:

int GEO::geofile::simplify_plane_surfaces()
{
    std::set<int>       gaps;
    std::set<int>       numbers;
    std::map<int, int>  changes;
    // Store all gaps
    // before start
    if (plane_surfaces_map.begin()->first>1)
    {
        int total_pre_gaps = plane_surfaces_map.begin()->first - 1;
        for (size_t i = 1; i <= total_pre_gaps; i++)
        {
            gaps.insert(i);
        }
    }
    // after start
    auto plane_surface_it_end   = std::prev(plane_surfaces_map.end(),1);
    for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it!=plane_surface_it_end; pl_sur_it++)
    {
        auto look_ahead = std::next(pl_sur_it,1);
        for (int i = pl_sur_it->first+1; i < look_ahead->first; i++)
        {
            gaps.insert(i);
        }
    }
    if (!gaps.empty())
    {
        // Store all non-gaps
        plane_surface_it_end = plane_surfaces_map.end();
        for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it != plane_surface_it_end; pl_sur_it++)
        {
            numbers.insert(pl_sur_it->first);
        }
        perform_shift(gaps, numbers, changes);
        return adjust_plane_surfaces(changes);
    }
    return EXIT_SUCCESS;
}